

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O1

void raptor_sockaddr_make_wildcard4(int port,raptor_resolved_address *resolved_wild_out)

{
  ushort uVar1;
  int iVar2;
  _Head_base<0UL,_char_*,_false> _Var3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  int extraout_EDX;
  ushort uVar7;
  undefined4 in_register_0000003c;
  char **strp;
  uint uVar8;
  _Head_base<0UL,_char_*,_false> _Stack_128;
  char *pcStack_120;
  char acStack_118 [52];
  raptor_resolved_address rStack_e4;
  
  strp = (char **)CONCAT44(in_register_0000003c,port);
  if ((uint)port < 0x10000) {
    memset(resolved_wild_out,0,0x84);
    resolved_wild_out->addr[0] = '\x02';
    resolved_wild_out->addr[1] = '\0';
    *(ushort *)(resolved_wild_out->addr + 2) = (ushort)port << 8 | (ushort)port >> 8;
    resolved_wild_out->len = 0x10;
    return;
  }
  raptor_sockaddr_make_wildcard4();
  if ((uint)strp < 0x10000) {
    memset(resolved_wild_out,0,0x84);
    resolved_wild_out->addr[0] = '\n';
    resolved_wild_out->addr[1] = '\0';
    *(ushort *)(resolved_wild_out->addr + 2) = (ushort)strp << 8 | (ushort)strp >> 8;
    resolved_wild_out->len = 0x1c;
    return;
  }
  raptor_sockaddr_make_wildcard6();
  piVar5 = __errno_location();
  iVar2 = *piVar5;
  *strp = (char *)0x0;
  if (extraout_EDX != 0) {
    iVar4 = raptor_sockaddr_is_v4mapped(resolved_wild_out,&rStack_e4);
    if (iVar4 != 0) {
      resolved_wild_out = &rStack_e4;
    }
  }
  uVar1 = *(ushort *)resolved_wild_out->addr;
  if (uVar1 == 10) {
    pcVar6 = resolved_wild_out->addr + 8;
    uVar7 = *(ushort *)(resolved_wild_out->addr + 2) << 8 |
            *(ushort *)(resolved_wild_out->addr + 2) >> 8;
    uVar8 = *(uint *)(resolved_wild_out->addr + 0x18);
  }
  else {
    uVar8 = 0;
    if (uVar1 == 2) {
      pcVar6 = resolved_wild_out->addr + 4;
      uVar7 = *(ushort *)(resolved_wild_out->addr + 2) << 8 |
              *(ushort *)(resolved_wild_out->addr + 2) >> 8;
      uVar8 = 0;
    }
    else {
      uVar7 = 0;
      pcVar6 = (char *)0x0;
    }
  }
  if (pcVar6 != (char *)0x0) {
    pcVar6 = inet_ntop((uint)uVar1,pcVar6,acStack_118,0x2e);
    if (pcVar6 != (char *)0x0) {
      _Stack_128._M_head_impl = (char *)0x0;
      if (uVar8 == 0) {
        raptor::JoinHostPort((UniquePtr<char> *)&_Stack_128,acStack_118,(uint)uVar7);
      }
      else {
        raptor_asprintf(&pcStack_120,"%s%%25%u",acStack_118,(ulong)uVar8);
        raptor::JoinHostPort((UniquePtr<char> *)&_Stack_128,pcStack_120,(uint)uVar7);
        raptor::Free(pcStack_120);
      }
      _Var3._M_head_impl = _Stack_128._M_head_impl;
      _Stack_128._M_head_impl = (char *)0x0;
      *strp = _Var3._M_head_impl;
      std::unique_ptr<char,_raptor::DefaultDeleteChar>::~unique_ptr
                ((unique_ptr<char,_raptor::DefaultDeleteChar> *)&_Stack_128);
      goto LAB_0010d46b;
    }
  }
  raptor_asprintf(strp,"(sockaddr family=%d)",(ulong)*(ushort *)resolved_wild_out->addr);
LAB_0010d46b:
  *piVar5 = iVar2;
  return;
}

Assistant:

void raptor_sockaddr_make_wildcard4(int port,
                                    raptor_resolved_address* resolved_wild_out) {
    raptor_sockaddr_in* wild_out =
        reinterpret_cast<raptor_sockaddr_in*>(resolved_wild_out->addr);
    RAPTOR_ASSERT(port >= 0 && port < 65536);
    memset(resolved_wild_out, 0, sizeof(*resolved_wild_out));
    wild_out->sin_family = AF_INET;
    wild_out->sin_port = htons(static_cast<uint16_t>(port));
    resolved_wild_out->len = static_cast<socklen_t>(sizeof(raptor_sockaddr_in));
}